

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::Expect(WastParser *this,TokenType type)

{
  Location loc;
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  undefined8 in_R9;
  string local_a0;
  size_t local_80;
  size_t local_78;
  char *local_70;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_68;
  undefined1 local_60 [8];
  Token token;
  TokenType type_local;
  WastParser *this_local;
  
  token.field_2._20_4_ = type;
  bVar1 = Match(this,type);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    Consume((Token *)local_60,this);
    local_80 = (size_t)local_60;
    local_78 = token.loc.filename._M_len;
    local_70 = token.loc.filename._M_str;
    local_68.offset = (size_t)token.loc.field_1.field_1.offset;
    Token::to_string_clamp_abi_cxx11_(&local_a0,(Token *)local_60,0x50);
    uVar2 = std::__cxx11::string::c_str();
    pcVar3 = GetTokenTypeName(token.field_2._20_4_);
    loc.filename._M_str = (char *)local_78;
    loc.filename._M_len = local_80;
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_70;
    loc.field_1._8_8_ = local_68.offset;
    Error(this,loc,"unexpected token %s, expected %s.",uVar2,pcVar3,local_70,in_R9);
    std::__cxx11::string::~string((string *)&local_a0);
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::Expect(TokenType type) {
  if (!Match(type)) {
    Token token = Consume();
    Error(token.loc, "unexpected token %s, expected %s.",
          token.to_string_clamp(kMaxErrorTokenLength).c_str(),
          GetTokenTypeName(type));
    return Result::Error;
  }

  return Result::Ok;
}